

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pie.h
# Opt level: O0

int __thiscall PIE<8U>::Query(PIE<8U> *this,Data<8U> *data)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long in_RDI;
  uint pos;
  uint time;
  uint position;
  int ret;
  uint in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 local_1c;
  undefined4 local_14;
  
  local_14 = 0;
  uVar2 = Data<8U>::Hash((Data<8U> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffcc);
  uVar1 = *(uint *)(in_RDI + 0x6c);
  for (local_1c = 0; local_1c < *(uint *)(in_RDI + 0x70); local_1c = local_1c + 1) {
    uVar3 = (uint)(*(short *)(*(long *)(in_RDI + 0x78) +
                             (ulong)(uVar2 % uVar1 + local_1c * *(int *)(in_RDI + 0x6c)) * 2) >> 2);
    uVar4 = Data<8U>::Hash((Data<8U> *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),
                           in_stack_ffffffffffffffcc);
    if (uVar3 == (uVar4 & 0x3fff)) {
      local_14 = local_14 + 1;
    }
  }
  return local_14;
}

Assistant:

int Query(const Data<DATA_LEN>& data) {
		int ret = 0;
		uint position = data.Hash() % LENGTH;
		for (uint time = 0; time < CYCLE; ++time) {
			uint pos = position + time * LENGTH;
			if (counter[pos].print == (data.Hash(1) & MASK_PRINT)) ret += 1;
		}
		return ret;
	}